

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  TypedID<(spirv_cross::Types)1> TVar6;
  uint32_t value;
  TypedID *this_00;
  size_t sVar7;
  TypedID<(spirv_cross::Types)1> *pTVar8;
  size_type sVar9;
  SPIRType *pSVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  Vector<std::function<void_()>_> *pVVar13;
  char (*ts_2) [2];
  bool local_54b;
  bool local_54a;
  bool local_549;
  bool local_53d;
  uint32_t local_52c;
  anon_class_56_4_6b62cf2f local_528;
  function<void_()> local_4f0;
  anon_class_360_4_54ccc45b local_4d0;
  function<void_()> local_368;
  TypedID<(spirv_cross::Types)0> local_344;
  SPIRConstant *local_340;
  SPIRConstant *c;
  uint32_t local_330;
  uint32_t local_32c;
  uint32_t local_328;
  uint32_t local_324;
  uint32_t comp_1;
  BuiltIn local_31c;
  BuiltIn local_318;
  uint32_t local_314;
  BuiltIn local_310;
  BuiltIn local_30c;
  uint32_t local_308;
  TypedID<(spirv_cross::Types)1> local_304;
  TypedID<(spirv_cross::Types)1> local_300;
  uint32_t local_2fc;
  TypedID<(spirv_cross::Types)1> local_2f8;
  uint32_t local_2f4;
  uint32_t local_2f0;
  TypedID<(spirv_cross::Types)1> local_2ec;
  TypedID<(spirv_cross::Types)1> local_2e8;
  uint32_t local_2e4;
  TypedID<(spirv_cross::Types)1> local_2e0;
  uint32_t local_2dc;
  uint32_t local_2d8;
  uint32_t local_2d4;
  uint32_t comp;
  uint32_t local_2cc;
  anon_class_72_3_6051d170 local_2c8;
  function<void_()> local_280;
  anon_class_72_3_25677804 local_260;
  function<void_()> local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  string var_chain;
  undefined1 local_190 [7];
  bool flatten_stage_out;
  string local_170;
  uint32_t local_14c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string qual_var_name;
  allocator local_f1;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  string mbr_name;
  TypedID<(spirv_cross::Types)1> local_88;
  uint32_t local_84;
  TypedID<(spirv_cross::Types)1> local_80;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t ib_mbr_idx;
  uint32_t mbr_type_id;
  bool local_69;
  uint32_t local_68;
  TypedID<(spirv_cross::Types)1> TStack_64;
  bool is_sample;
  bool local_5d;
  uint32_t local_5c;
  TypedID<(spirv_cross::Types)1> TStack_58;
  bool is_centroid;
  bool local_51;
  uint32_t local_50;
  TypedID<(spirv_cross::Types)1> TStack_4c;
  bool is_noperspective;
  bool local_46;
  byte local_45;
  BuiltIn local_44;
  bool is_flat;
  bool is_builtin;
  SPIRFunction *pSStack_40;
  BuiltIn builtin;
  SPIRFunction *entry_func;
  SPIRType *var_type_local;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *pCStack_10;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  entry_func = (SPIRFunction *)var_type;
  var_type_local = (SPIRType *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local._4_4_ = storage;
  pCStack_10 = this;
  uVar4 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  pSStack_40 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar4);
  local_44 = BuiltInMax;
  local_45 = Compiler::is_member_builtin((Compiler *)this,(SPIRType *)entry_func,mbr_idx,&local_44);
  TStack_4c = TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  bVar2 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)TStack_4c.id,mbr_idx,DecorationFlat);
  local_53d = true;
  if (!bVar2) {
    local_50 = (var_type_local->super_IVariant).self.id;
    local_53d = Compiler::has_decoration((Compiler *)this,(ID)local_50,DecorationFlat);
  }
  local_46 = local_53d;
  TStack_58 = TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  bVar2 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)TStack_58.id,mbr_idx,DecorationNoPerspective);
  local_549 = true;
  if (!bVar2) {
    local_5c = (var_type_local->super_IVariant).self.id;
    local_549 = Compiler::has_decoration((Compiler *)this,(ID)local_5c,DecorationNoPerspective);
  }
  local_51 = local_549;
  TStack_64 = TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  bVar2 = Compiler::has_member_decoration((Compiler *)this,(TypeID)TStack_64.id,mbr_idx,Centroid);
  local_54a = true;
  if (!bVar2) {
    local_68 = (var_type_local->super_IVariant).self.id;
    local_54a = Compiler::has_decoration((Compiler *)this,(ID)local_68,Centroid);
  }
  local_5d = local_54a;
  mbr_type_id = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  bVar2 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)mbr_type_id,mbr_idx,DecorationSample);
  local_54b = true;
  if (!bVar2) {
    ib_mbr_idx = (var_type_local->super_IVariant).self.id;
    local_54b = Compiler::has_decoration((Compiler *)this,(ID)ib_mbr_idx,DecorationSample);
  }
  local_69 = local_54b;
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       ((entry_func->arguments).stack_storage.aligned_char + 0x58),(ulong)mbr_idx);
  local_78 = TypedID::operator_cast_to_unsigned_int(this_00);
  sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                    ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                     ((var_local->dependees).stack_storage.aligned_char + 0x10));
  local_7c = (uint32_t)sVar7;
  local_78 = ensure_correct_builtin_type(this,local_78,local_44);
  TypedID<(spirv_cross::Types)1>::TypedID(&local_80,local_78);
  pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                      ((entry_func->arguments).stack_storage.aligned_char + 0x58),(ulong)mbr_idx);
  pTVar8->id = local_80.id;
  bVar2 = false;
  if (ib_var_ref_local._4_4_ == Input) {
    local_84 = TypedID::operator_cast_to_unsigned_int
                         ((TypedID *)&(var_type_local->super_IVariant).self);
    sVar9 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->pull_model_inputs,&local_84);
    bVar2 = sVar9 != 0;
  }
  if (bVar2) {
    pSVar1 = &var_local->dependees;
    uVar4 = build_msl_interpolant_type(this,local_78,(bool)(local_51 & 1));
    TypedID<(spirv_cross::Types)1>::TypedID(&local_88,uVar4);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
               ((pSVar1->stack_storage).aligned_char + 0x10),&local_88);
  }
  else {
    pSVar1 = &var_local->dependees;
    TypedID<(spirv_cross::Types)1>::TypedID
              ((TypedID<(spirv_cross::Types)1> *)((long)&mbr_name.field_2 + 0xc),local_78);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
               ((pSVar1->stack_storage).aligned_char + 0x10),
               (TypedID<(spirv_cross::Types)1> *)((long)&mbr_name.field_2 + 0xc));
  }
  ts_2 = (char (*) [2])(ulong)mbr_idx;
  append_member_name(&local_d0,this,mbr_name_qual,(SPIRType *)entry_func,mbr_idx);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_f0,"m",&local_f1);
  ensure_valid_name((string *)local_b0,this,&local_d0,&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  ::std::__cxx11::string::~string((string *)&local_d0);
  qual_var_name.field_2._8_4_ =
       TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
  Compiler::set_member_name
            ((Compiler *)this,(TypeID)qual_var_name.field_2._8_4_,local_7c,(string *)local_b0);
  ::std::operator+(&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ib_type_local,".");
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   &local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  ::std::__cxx11::string::~string((string *)&local_148);
  bVar2 = false;
  if (ib_var_ref_local._4_4_ == Input) {
    local_14c = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(var_type_local->super_IVariant).self);
    sVar9 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->pull_model_inputs,&local_14c);
    bVar2 = sVar9 != 0;
  }
  if (bVar2) {
    if ((local_5d & 1U) == 0) {
      if ((local_69 & 1U) == 0) {
        ::std::__cxx11::string::operator+=((string *)local_128,".interpolate_at_center()");
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)local_190,&this->super_CompilerGLSL,this->builtin_sample_id_id,true);
        join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  (&local_170,(spirv_cross *)".interpolate_at_sample(",(char (*) [24])local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
                   ts_2);
        ::std::__cxx11::string::operator+=((string *)local_128,(string *)&local_170);
        ::std::__cxx11::string::~string((string *)&local_170);
        ::std::__cxx11::string::~string((string *)local_190);
      }
    }
    else {
      ::std::__cxx11::string::operator+=((string *)local_128,".interpolate_at_centroid()");
    }
  }
  var_chain.field_2._M_local_buf[0xf] = '\0';
  ::std::operator+(&local_1d8,var_chain_qual,".");
  CompilerGLSL::to_member_name_abi_cxx11_
            (&local_1f8,&this->super_CompilerGLSL,(SPIRType *)entry_func,mbr_idx);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   &local_1d8,&local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1d8);
  if (((local_45 & 1) == 0) || ((meta->strip_array & 1U) != 0)) {
    if (((meta->strip_array & 1U) == 0) && ((meta->allow_local_declaration & 1U) != 0)) {
      if (ib_var_ref_local._4_4_ == Input) {
        pVVar13 = &pSStack_40->fixup_hooks_in;
        local_260.this = this;
        ::std::__cxx11::string::string((string *)&local_260.var_chain,(string *)local_1b8);
        ::std::__cxx11::string::string((string *)&local_260.qual_var_name,(string *)local_128);
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)::__0,void>
                  ((function<void()> *)&local_218,&local_260);
        SmallVector<std::function<void_()>,_0UL>::push_back(pVVar13,&local_218);
        ::std::function<void_()>::~function(&local_218);
        add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
        ::$_0::~__0((__0 *)&local_260);
      }
      else if (ib_var_ref_local._4_4_ == Output) {
        var_chain.field_2._M_local_buf[0xf] = '\x01';
        pVVar13 = &pSStack_40->fixup_hooks_out;
        local_2c8.this = this;
        ::std::__cxx11::string::string((string *)&local_2c8.qual_var_name,(string *)local_128);
        ::std::__cxx11::string::string((string *)&local_2c8.var_chain,(string *)local_1b8);
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)::__1,void>
                  ((function<void()> *)&local_280,&local_2c8);
        SmallVector<std::function<void_()>,_0UL>::push_back(pVVar13,&local_280);
        ::std::function<void_()>::~function(&local_280);
        add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
        ::$_1::~__1((__1 *)&local_2c8);
      }
    }
  }
  else {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(entry_func->super_IVariant).self);
    Compiler::set_member_qualified_name((Compiler *)this,uVar4,mbr_idx,(string *)local_128);
  }
  if (((local_45 & 1) == 0) && (*location != 0xffffffff)) {
    local_2cc = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)local_2cc,local_7c,DecorationLocation,*location);
    uVar4 = *location;
    pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
    mark_location_as_used_by_shader(this,uVar4,pSVar10,ib_var_ref_local._4_4_,false);
    pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
    uVar4 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar10);
    *location = uVar4 + *location;
  }
  else {
    comp = (uint32_t)
           TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
    bVar2 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)comp,mbr_idx,DecorationLocation);
    if (bVar2) {
      local_2d4 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
      uVar4 = Compiler::get_member_decoration
                        ((Compiler *)this,(TypeID)local_2d4,mbr_idx,DecorationLocation);
      *location = uVar4;
      local_2dc = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
      local_2d8 = Compiler::get_member_decoration
                            ((Compiler *)this,(TypeID)local_2dc,mbr_idx,Component);
      if (ib_var_ref_local._4_4_ == Input) {
        local_78 = ensure_correct_input_type
                             (this,local_78,*location,local_2d8,0,(bool)(meta->strip_array & 1));
        TypedID<(spirv_cross::Types)1>::TypedID(&local_2e0,local_78);
        pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                           ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                            ((entry_func->arguments).stack_storage.aligned_char + 0x58),
                            (ulong)mbr_idx);
        pTVar8->id = local_2e0.id;
        bVar2 = false;
        if (ib_var_ref_local._4_4_ == Input) {
          local_2e4 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(var_type_local->super_IVariant).self);
          sVar9 = ::std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::count(&this->pull_model_inputs,&local_2e4);
          bVar2 = sVar9 != 0;
        }
        if (bVar2) {
          uVar4 = build_msl_interpolant_type(this,local_78,(bool)(local_51 & 1));
          TypedID<(spirv_cross::Types)1>::TypedID(&local_2e8,uVar4);
          pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                             ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                              ((var_local->dependees).stack_storage.aligned_char + 0x10),
                              (ulong)local_7c);
          pTVar8->id = local_2e8.id;
        }
        else {
          TypedID<(spirv_cross::Types)1>::TypedID(&local_2ec,local_78);
          pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                             ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                              ((var_local->dependees).stack_storage.aligned_char + 0x10),
                              (ulong)local_7c);
          pTVar8->id = local_2ec.id;
        }
      }
      local_2f0 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_2f0,local_7c,DecorationLocation,*location);
      uVar4 = *location;
      pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
      mark_location_as_used_by_shader(this,uVar4,pSVar10,ib_var_ref_local._4_4_,false);
      pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
      uVar4 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar10);
      *location = uVar4 + *location;
    }
    else {
      local_2f4 = (var_type_local->super_IVariant).self.id;
      bVar2 = Compiler::has_decoration((Compiler *)this,(ID)local_2f4,DecorationLocation);
      if (bVar2) {
        uVar4 = CompilerGLSL::get_accumulated_member_location
                          (&this->super_CompilerGLSL,(SPIRVariable *)var_type_local,mbr_idx,
                           (bool)(meta->strip_array & 1));
        *location = uVar4;
        if (ib_var_ref_local._4_4_ == Input) {
          local_78 = ensure_correct_input_type
                               (this,local_78,*location,0,0,(bool)(meta->strip_array & 1));
          TypedID<(spirv_cross::Types)1>::TypedID(&local_2f8,local_78);
          pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                             ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                              ((entry_func->arguments).stack_storage.aligned_char + 0x58),
                              (ulong)mbr_idx);
          pTVar8->id = local_2f8.id;
          bVar2 = false;
          if (ib_var_ref_local._4_4_ == Input) {
            local_2fc = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(var_type_local->super_IVariant).self);
            sVar9 = ::std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::count(&this->pull_model_inputs,&local_2fc);
            bVar2 = sVar9 != 0;
          }
          if (bVar2) {
            uVar4 = build_msl_interpolant_type(this,local_78,(bool)(local_51 & 1));
            TypedID<(spirv_cross::Types)1>::TypedID(&local_300,uVar4);
            pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                               ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                                ((var_local->dependees).stack_storage.aligned_char + 0x10),
                                (ulong)local_7c);
            pTVar8->id = local_300.id;
          }
          else {
            TypedID<(spirv_cross::Types)1>::TypedID(&local_304,local_78);
            pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                               ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                                ((var_local->dependees).stack_storage.aligned_char + 0x10),
                                (ulong)local_7c);
            pTVar8->id = local_304.id;
          }
        }
        local_308 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)local_308,local_7c,DecorationLocation,*location);
        uVar4 = *location;
        pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
        mark_location_as_used_by_shader(this,uVar4,pSVar10,ib_var_ref_local._4_4_,false);
        pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
        uVar4 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar10);
        *location = uVar4 + *location;
      }
      else {
        bVar2 = false;
        if ((local_45 & 1) != 0) {
          bVar3 = Compiler::is_tessellation_shader((Compiler *)this);
          bVar2 = false;
          if ((bVar3) && (bVar2 = false, ib_var_ref_local._4_4_ == Input)) {
            local_30c = local_44;
            sVar11 = ::std::
                     unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                     ::count(&this->inputs_by_builtin,&local_30c);
            bVar2 = sVar11 != 0;
          }
        }
        if (bVar2) {
          local_310 = local_44;
          pmVar12 = ::std::
                    unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                    ::operator[](&this->inputs_by_builtin,&local_310);
          *location = pmVar12->location;
          local_314 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(var_local->super_IVariant).self);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)local_314,local_7c,DecorationLocation,*location);
          uVar4 = *location;
          pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
          mark_location_as_used_by_shader(this,uVar4,pSVar10,ib_var_ref_local._4_4_,false);
          pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
          uVar4 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar10);
          *location = uVar4 + *location;
        }
        else {
          bVar2 = false;
          if ((((local_45 & 1) != 0) && (bVar2 = false, (this->capture_output_to_buffer & 1U) != 0))
             && (bVar2 = false, ib_var_ref_local._4_4_ == Output)) {
            local_318 = local_44;
            sVar11 = ::std::
                     unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                     ::count(&this->outputs_by_builtin,&local_318);
            bVar2 = sVar11 != 0;
          }
          if (bVar2) {
            local_31c = local_44;
            pmVar12 = ::std::
                      unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                      ::operator[](&this->outputs_by_builtin,&local_31c);
            *location = pmVar12->location;
            comp_1 = (uint32_t)
                     TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self)
            ;
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)comp_1,local_7c,DecorationLocation,*location);
            uVar4 = *location;
            pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
            mark_location_as_used_by_shader(this,uVar4,pSVar10,ib_var_ref_local._4_4_,false);
            pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,local_78);
            uVar4 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar10);
            *location = uVar4 + *location;
          }
        }
      }
    }
  }
  local_324 = (uint32_t)
              TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
  bVar2 = Compiler::has_member_decoration((Compiler *)this,(TypeID)local_324,mbr_idx,Component);
  if (bVar2) {
    local_32c = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(entry_func->super_IVariant).self);
    local_328 = Compiler::get_member_decoration
                          ((Compiler *)this,(TypeID)local_32c,mbr_idx,Component);
    local_330 = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_decoration((Compiler *)this,(TypeID)local_330,local_7c,Component,local_328)
    ;
  }
  if ((local_45 & 1) != 0) {
    c._4_4_ = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_decoration((Compiler *)this,(TypeID)c._4_4_,local_7c,BuiltIn,local_44);
    if ((local_44 == BuiltInPosition) && (ib_var_ref_local._4_4_ == Output)) {
      ::std::__cxx11::string::operator=((string *)&this->qual_pos_var_name,(string *)local_128);
    }
  }
  local_340 = (SPIRConstant *)0x0;
  bVar2 = false;
  if (((var_chain.field_2._M_local_buf[0xf] & 1U) == 0) &&
     (bVar2 = false, var_type_local->basetype == SByte)) {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type_local->vecsize);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_344,0);
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_344);
    bVar2 = false;
    if (uVar4 != uVar5) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&var_type_local->vecsize);
      local_340 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar4);
      bVar2 = local_340 != (SPIRConstant *)0x0;
    }
  }
  if (bVar2) {
    if ((meta->strip_array & 1U) == 0) {
      pVVar13 = &pSStack_40->fixup_hooks_in;
      local_528.this = this;
      ::std::__cxx11::string::string((string *)&local_528.qual_var_name,(string *)local_128);
      local_528.c = local_340;
      local_528.mbr_idx = mbr_idx;
      ::std::function<void()>::
      function<spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)::__3,void>
                ((function<void()> *)&local_4f0,&local_528);
      SmallVector<std::function<void_()>,_0UL>::push_back(pVVar13,&local_4f0);
      ::std::function<void_()>::~function(&local_4f0);
      add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
      ::$_3::~__3((__3 *)&local_528);
    }
    else {
      pVVar13 = &pSStack_40->fixup_hooks_in;
      local_4d0.var = (SPIRVariable *)var_type_local;
      local_4d0.mbr_idx = mbr_idx;
      local_4d0.this = this;
      SPIRType::SPIRType(&local_4d0.ib_type,(SPIRType *)var_local);
      ::std::function<void()>::
      function<spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)::__2,void>
                ((function<void()> *)&local_368,&local_4d0);
      SmallVector<std::function<void_()>,_0UL>::push_back(pVVar13,&local_368);
      ::std::function<void_()>::~function(&local_368);
      add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
      ::$_2::~__2((__2 *)&local_4d0);
    }
  }
  bVar2 = true;
  if (ib_var_ref_local._4_4_ == Input) {
    local_52c = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(var_type_local->super_IVariant).self);
    sVar9 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&this->pull_model_inputs,&local_52c);
    bVar2 = sVar9 == 0;
  }
  if (bVar2) {
    if ((local_46 & 1U) != 0) {
      TVar6 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration((Compiler *)this,(TypeID)TVar6.id,local_7c,DecorationFlat,0);
    }
    if ((local_51 & 1U) != 0) {
      TVar6 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)TVar6.id,local_7c,DecorationNoPerspective,0);
    }
    if ((local_5d & 1U) != 0) {
      TVar6 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration((Compiler *)this,(TypeID)TVar6.id,local_7c,Centroid,0);
    }
    if ((local_69 & 1U) != 0) {
      TVar6 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration((Compiler *)this,(TypeID)TVar6.id,local_7c,DecorationSample,0)
      ;
    }
  }
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_local->super_IVariant).self);
  uVar4 = local_7c;
  value = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_type_local->super_IVariant).self);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,uVar5,uVar4,SPIRVCrossDecorationInterfaceOrigID,value);
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_local->super_IVariant).self);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,uVar4,local_7c,SPIRVCrossDecorationInterfaceMemberIndex,*var_mbr_idx);
  ::std::__cxx11::string::~string((string *)local_1b8);
  ::std::__cxx11::string::~string((string *)local_128);
  ::std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void CompilerMSL::add_plain_member_variable_to_interface_block(StorageClass storage,
                                                               const string &ib_var_ref, SPIRType &ib_type,
                                                               SPIRVariable &var, SPIRType &var_type,
                                                               uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                               const string &mbr_name_qual,
                                                               const string &var_chain_qual,
                                                               uint32_t &location, uint32_t &var_mbr_idx)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat =
	    has_member_decoration(var_type.self, mbr_idx, DecorationFlat) || has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample =
	    has_member_decoration(var_type.self, mbr_idx, DecorationSample) || has_decoration(var.self, DecorationSample);

	// Add a reference to the member to the interface struct.
	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
	mbr_type_id = ensure_correct_builtin_type(mbr_type_id, builtin);
	var_type.member_types[mbr_idx] = mbr_type_id;
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
		ib_type.member_types.push_back(build_msl_interpolant_type(mbr_type_id, is_noperspective));
	else
		ib_type.member_types.push_back(mbr_type_id);

	// Give the member a name
	string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx), "m");
	set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

	// Update the original variable reference to include the structure reference
	string qual_var_name = ib_var_ref + "." + mbr_name;
	// If using pull-model interpolation, need to add a call to the correct interpolation method.
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
	{
		if (is_centroid)
			qual_var_name += ".interpolate_at_centroid()";
		else if (is_sample)
			qual_var_name += join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
		else
			qual_var_name += ".interpolate_at_center()";
	}

	bool flatten_stage_out = false;
	string var_chain = var_chain_qual + "." + to_member_name(var_type, mbr_idx);
	if (is_builtin && !meta.strip_array)
	{
		// For the builtin gl_PerVertex, we cannot treat it as a block anyways,
		// so redirect to qualified name.
		set_member_qualified_name(var_type.self, mbr_idx, qual_var_name);
	}
	else if (!meta.strip_array && meta.allow_local_declaration)
	{
		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		switch (storage)
		{
		case StorageClassInput:
			entry_func.fixup_hooks_in.push_back([=]() {
				statement(var_chain, " = ", qual_var_name, ";");
			});
			break;

		case StorageClassOutput:
			flatten_stage_out = true;
			entry_func.fixup_hooks_out.push_back([=]() {
				statement(qual_var_name, " = ", var_chain, ";");
			});
			break;

		default:
			break;
		}
	}

	// Once we determine the location of the first member within nested structures,
	// from a var of the topmost structure, the remaining flattened members of
	// the nested structures will have consecutive location values. At this point,
	// we've recursively tunnelled into structs, arrays, and matrices, and are
	// down to a single location for each member now.
	if (!is_builtin && location != UINT32_MAX)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (has_member_decoration(var_type.self, mbr_idx, DecorationLocation))
	{
		location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation);
		uint32_t comp = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);
		if (storage == StorageClassInput)
		{
			mbr_type_id = ensure_correct_input_type(mbr_type_id, location, comp, 0, meta.strip_array);
			var_type.member_types[mbr_idx] = mbr_type_id;
			if (storage == StorageClassInput && pull_model_inputs.count(var.self))
				ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
			else
				ib_type.member_types[ib_mbr_idx] = mbr_type_id;
		}
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (has_decoration(var.self, DecorationLocation))
	{
		location = get_accumulated_member_location(var, mbr_idx, meta.strip_array);
		if (storage == StorageClassInput)
		{
			mbr_type_id = ensure_correct_input_type(mbr_type_id, location, 0, 0, meta.strip_array);
			var_type.member_types[mbr_idx] = mbr_type_id;
			if (storage == StorageClassInput && pull_model_inputs.count(var.self))
				ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
			else
				ib_type.member_types[ib_mbr_idx] = mbr_type_id;
		}
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
	{
		location = inputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
	{
		location = outputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}

	// Copy the component location, if present.
	if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
	{
		uint32_t comp = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
	}

	// Mark the member as builtin if needed
	if (is_builtin)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
		if (builtin == BuiltInPosition && storage == StorageClassOutput)
			qual_pos_var_name = qual_var_name;
	}

	const SPIRConstant *c = nullptr;
	if (!flatten_stage_out && var.storage == StorageClassOutput &&
	    var.initializer != ID(0) && (c = maybe_get<SPIRConstant>(var.initializer)))
	{
		if (meta.strip_array)
		{
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				auto &type = this->get<SPIRType>(var.basetype);
				uint32_t index = get_extended_member_decoration(var.self, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex);

				auto invocation = to_tesc_invocation_id();
				auto constant_chain = join(to_expression(var.initializer), "[", invocation, "]");
				statement(to_expression(stage_out_ptr_var_id), "[",
				          invocation, "].",
				          to_member_name(ib_type, index), " = ",
				          constant_chain, ".", to_member_name(type, mbr_idx), ";");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([=]() {
				statement(qual_var_name, " = ", constant_expression(
						this->get<SPIRConstant>(c->subconstants[mbr_idx])), ";");
			});
		}
	}

	if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
	{
		// Copy interpolation decorations if needed
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
	}

	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);
}